

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afk.cc
# Opt level: O3

void __thiscall AfkProcessor::flow_print(AfkProcessor *this,Params *args)

{
  undefined8 *puVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  undefined8 uStack_8;
  
  puVar1 = (undefined8 *)
           (args->argv_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  uStack_8 = in_RAX;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*puVar1,puVar1[1]);
  uStack_8 = CONCAT17(10,(undefined7)uStack_8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_8 + 7),1);
  return;
}

Assistant:

void AfkProcessor::flow_print(flow::Params& args) {
  std::cout << args.getString(1) << '\n';
}